

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

void google::protobuf::internal::SingularFieldHelper<11>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  
  uVar4 = md->tag;
  pbVar2 = output->ptr;
  if (uVar4 < 0x80) {
    *pbVar2 = (byte)uVar4;
    pbVar2 = pbVar2 + 1;
  }
  else {
    *pbVar2 = (byte)uVar4 | 0x80;
    if (uVar4 < 0x4000) {
      pbVar2[1] = (byte)(uVar4 >> 7);
      pbVar2 = pbVar2 + 2;
    }
    else {
      pbVar2 = pbVar2 + 2;
      uVar4 = uVar4 >> 7;
      do {
        pbVar3 = pbVar2;
        pbVar3[-1] = (byte)uVar4 | 0x80;
        uVar5 = uVar4 >> 7;
        pbVar2 = pbVar3 + 1;
        bVar1 = 0x3fff < uVar4;
        uVar4 = uVar5;
      } while (bVar1);
      *pbVar3 = (byte)uVar5;
    }
  }
  output->ptr = pbVar2;
  SerializeMessageTo<google::protobuf::internal::ArrayOutput>(*field,md->ptr,output);
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    WriteTagTo(md.tag, output);
    SerializeMessageTo(Get<const MessageLite*>(field),
                       static_cast<const SerializationTable*>(md.ptr), output);
  }